

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureDerivateCase::init(TextureDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Precision PVar6;
  SurfaceType SVar7;
  TextureFormat *pTVar8;
  int i_1;
  char *pcVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  Texture2D *this_00;
  RenderTarget *pRVar12;
  deUint32 sizedFormat;
  int iVar13;
  DataType DVar14;
  Precision precision;
  int iVar15;
  char *pcVar16;
  int i;
  long lVar17;
  float fVar18;
  float fVar19;
  Vec4 s;
  Vector<float,_4> res_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vector<float,_4> res_10;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [8];
  undefined8 local_a8;
  _Base_ptr local_a0;
  TextureFormat local_98;
  size_t local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  float local_5c;
  float local_58 [10];
  
  PVar6 = (this->super_TriangleDerivateCase).m_surfaceType;
  local_a0 = (_Base_ptr)auStack_b0;
  auStack_b0 = (undefined1  [8])((ulong)auStack_b0 & 0xffffffff00000000);
  local_a8 = (_Base_ptr)0x0;
  local_90 = 0;
  DVar14 = TYPE_FLOAT_VEC4;
  if (PVar6 == PRECISION_HIGHP) {
    DVar14 = TYPE_UINT_VEC4;
  }
  local_98 = (TextureFormat)local_a0;
  pcVar9 = glu::getDataTypeName(DVar14);
  local_f8 = (undefined1  [8])&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"OUTPUT_TYPE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b8,(key_type *)local_f8);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  precision = PVar6;
  if (PVar6 != PRECISION_HIGHP) {
    precision = (this->super_TriangleDerivateCase).m_precision;
  }
  pcVar9 = glu::getPrecisionName(precision);
  local_f8 = (undefined1  [8])&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"OUTPUT_PREC","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b8,(key_type *)local_f8);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  pcVar9 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  local_f8 = (undefined1  [8])&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"PRECISION","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b8,(key_type *)local_f8);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  pcVar9 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  local_f8 = (undefined1  [8])&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"DATATYPE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b8,(key_type *)local_f8);
  pcVar16 = (char *)pmVar10->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar16,(ulong)pcVar9);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  uVar11 = (ulong)*(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (uVar11 < 3) {
    pcVar16 = (&PTR_anon_var_dwarf_246e74c_02197ef8)[uVar11];
  }
  else {
    pcVar16 = (char *)0x0;
  }
  local_f8 = (undefined1  [8])&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"FUNC","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b8,(key_type *)local_f8);
  pcVar9 = (char *)pmVar10->_M_string_length;
  strlen(pcVar16);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar16);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  DVar14 = (this->super_TriangleDerivateCase).m_dataType;
  if (DVar14 == TYPE_FLOAT_VEC3) {
    pcVar16 = ".xyz";
  }
  else if (DVar14 == TYPE_FLOAT_VEC4) {
    pcVar16 = glcts::fixed_sample_locations_values + 1;
  }
  else {
    pcVar16 = ".x";
    if (DVar14 == TYPE_FLOAT_VEC2) {
      pcVar16 = ".xy";
    }
  }
  local_f8 = (undefined1  [8])&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"SWIZZLE","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b8,(key_type *)local_f8);
  pcVar9 = (char *)pmVar10->_M_string_length;
  strlen(pcVar16);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar16);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  DVar14 = (this->super_TriangleDerivateCase).m_dataType;
  if (PVar6 == PRECISION_HIGHP) {
    if (DVar14 == TYPE_FLOAT_VEC3) {
      pcVar16 = "floatBitsToUint(vec4(res, 1.0))";
    }
    else if (DVar14 == TYPE_FLOAT_VEC4) {
      pcVar16 = "floatBitsToUint(res)";
    }
    else {
      pcVar16 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
      if (DVar14 == TYPE_FLOAT_VEC2) {
        pcVar16 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
      }
    }
    local_f8 = (undefined1  [8])&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"CAST_TO_OUTPUT","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_b8,(key_type *)local_f8);
    pcVar9 = (char *)pmVar10->_M_string_length;
    strlen(pcVar16);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar16);
  }
  else {
    if (DVar14 == TYPE_FLOAT_VEC3) {
      pcVar16 = "vec4(res, 1.0)";
    }
    else if (DVar14 == TYPE_FLOAT_VEC4) {
      pcVar16 = "res";
    }
    else {
      pcVar16 = "vec4(res, 0.0, 0.0, 1.0)";
      if (DVar14 == TYPE_FLOAT_VEC2) {
        pcVar16 = "vec4(res, 0.0, 1.0)";
      }
    }
    local_f8 = (undefined1  [8])&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"CAST_TO_OUTPUT","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_b8,(key_type *)local_f8);
    pcVar9 = (char *)pmVar10->_M_string_length;
    strlen(pcVar16);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar9,(ulong)pcVar16);
  }
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  local_88 = (undefined1  [8])&local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,
             "#version 300 es\nin highp vec2 v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} sampler2D u_sampler;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_d8,(string *)local_88);
  tcu::StringTemplate::specialize
            ((string *)local_f8,(StringTemplate *)local_d8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_b8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)local_f8);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_d8);
  if (local_88 != (undefined1  [8])&local_78) {
    operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b8);
  uVar11 = (ulong)(this->super_TriangleDerivateCase).m_precision;
  if (uVar11 < 3) {
    fVar18 = *(float *)(&DAT_01c5df6c + uVar11 * 4);
    fVar19 = *(float *)(&DAT_01c5df78 + uVar11 * 4);
    fVar1 = *(float *)(&DAT_01c5df84 + uVar11 * 4);
    fVar2 = *(float *)(&DAT_01c5df90 + uVar11 * 4);
    fVar3 = *(float *)(&DAT_01c5df9c + uVar11 * 4);
    fVar4 = *(float *)(&DAT_01c5dfa8 + uVar11 * 4);
    fVar5 = *(float *)(&DAT_01c5dfb4 + uVar11 * 4);
    (this->m_texValueMin).m_data[0] = *(float *)(&DAT_01c5df60 + uVar11 * 4);
    (this->m_texValueMin).m_data[1] = fVar18;
    (this->m_texValueMin).m_data[2] = fVar19;
    (this->m_texValueMin).m_data[3] = fVar1;
    (this->m_texValueMax).m_data[0] = fVar2;
    (this->m_texValueMax).m_data[1] = fVar3;
    (this->m_texValueMax).m_data[2] = fVar4;
    (this->m_texValueMax).m_data[3] = fVar5;
  }
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar15 = 0xa7;
    if (pRVar12->m_width < 0xa7) {
      iVar15 = pRVar12->m_width;
    }
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar13 = 0x67;
    if (pRVar12->m_height < 0x67) {
      iVar13 = pRVar12->m_height;
    }
  }
  else {
    iVar15 = 99;
    iVar13 = 0x85;
  }
  this_00 = (Texture2D *)operator_new(0x70);
  sizedFormat = 0x881a;
  if ((this->super_TriangleDerivateCase).m_precision == PRECISION_HIGHP) {
    sizedFormat = 0x8814;
  }
  glu::Texture2D::Texture2D
            (this_00,((this->super_TriangleDerivateCase).super_TestCase.m_context)->m_renderCtx,
             sizedFormat,iVar15,iVar13);
  this->m_texture = this_00;
  lVar17 = 0;
  tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
  (this->super_TriangleDerivateCase).m_coordMin.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[3] = 0.0;
  do {
    *(undefined4 *)(local_b8 + lVar17 * 4) = 0x3f800000;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  *(undefined1 (*) [8])(this->super_TriangleDerivateCase).m_coordMax.m_data = local_b8;
  *(undefined1 (*) [8])((this->super_TriangleDerivateCase).m_coordMax.m_data + 2) = auStack_b0;
  pTVar8 = (TextureFormat *)
           (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b8._0_4_ = pTVar8->order;
  local_b8._4_4_ = pTVar8->type;
  lVar17 = 2;
  do {
    *(ChannelOrder *)(local_b8 + lVar17 * 4) = (&pTVar8->order)[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  lVar17 = 5;
  do {
    *(ChannelOrder *)(local_b8 + lVar17 * 4) = (&pTVar8->order)[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 8);
  local_98 = pTVar8[4];
  if (0 < (int)auStack_b0._4_4_) {
    iVar15 = 0;
    do {
      if (0 < (int)auStack_b0._0_4_) {
        local_5c = (float)iVar15 + 0.5;
        iVar13 = 0;
        do {
          local_f8._0_4_ = ((float)iVar13 + 0.5) / (float)(int)auStack_b0._0_4_;
          fVar18 = ((float)local_f8._0_4_ + local_5c / (float)(int)auStack_b0._4_4_) * 0.5;
          local_f8._4_4_ = local_5c / (float)(int)auStack_b0._4_4_;
          uStack_f0 = CONCAT44(1.0 - fVar18,fVar18);
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          local_58[2] = 0.0;
          local_58[3] = 0.0;
          lVar17 = 0;
          do {
            local_58[lVar17] =
                 (this->m_texValueMax).m_data[lVar17] - (this->m_texValueMin).m_data[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          local_88 = (undefined1  [8])0x0;
          uStack_80 = 0;
          lVar17 = 0;
          do {
            *(float *)(local_88 + lVar17 * 4) = local_58[lVar17] * *(float *)(local_f8 + lVar17 * 4)
            ;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          local_d8 = (undefined1  [8])0x0;
          uStack_d0 = 0;
          lVar17 = 0;
          do {
            *(float *)(local_d8 + lVar17 * 4) =
                 (this->m_texValueMin).m_data[lVar17] + *(float *)(local_88 + lVar17 * 4);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_b8,(Vec4 *)local_d8,iVar13,iVar15,0);
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)auStack_b0._0_4_);
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < (int)auStack_b0._4_4_);
  }
  (*this->m_texture->_vptr_Texture2D[2])();
  SVar7 = (this->super_TriangleDerivateCase).m_surfaceType;
  if (SVar7 == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar15 = 0xa7;
    if (pRVar12->m_width < 0xa7) {
      iVar15 = pRVar12->m_width;
    }
    pRVar12 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar13 = 0x67;
    if (pRVar12->m_height < 0x67) {
      iVar13 = pRVar12->m_height;
    }
    local_d8._4_4_ = (undefined4)iVar15;
    local_88._4_4_ = (undefined4)iVar13;
LAB_0128914d:
    local_f8 = (undefined1  [8])0x0;
    uStack_f0 = 0;
    lVar17 = 0;
    do {
      *(float *)(local_f8 + lVar17 * 4) =
           (this->m_texValueMax).m_data[lVar17] - (this->m_texValueMin).m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_d8._0_4_ = local_d8._4_4_;
    uStack_d0 = CONCAT44((float)local_d8._4_4_ * -0.5,(float)local_d8._4_4_ * 0.5);
    local_b8._0_4_ = R;
    local_b8._4_4_ = SNORM_INT8;
    auStack_b0 = (undefined1  [8])0x0;
    lVar17 = 0;
    do {
      *(float *)(local_b8 + lVar17 * 4) =
           *(float *)(local_f8 + lVar17 * 4) / *(float *)(local_d8 + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_d8 = (undefined1  [8])0x0;
    uStack_d0 = 0;
    lVar17 = 0;
    do {
      *(float *)(local_d8 + lVar17 * 4) =
           (this->m_texValueMax).m_data[lVar17] - (this->m_texValueMin).m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_88._0_4_ = local_88._4_4_;
    uStack_80 = CONCAT44((float)local_88._4_4_ * -0.5,(float)local_88._4_4_ * 0.5);
    local_f8 = (undefined1  [8])0x0;
    uStack_f0 = 0;
    lVar17 = 0;
    do {
      *(float *)(local_f8 + lVar17 * 4) =
           *(float *)(local_d8 + lVar17 * 4) / *(float *)(local_88 + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    iVar15 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
    if (iVar15 == 2) {
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      local_58[2] = 0.0;
      local_58[3] = 0.0;
      lVar17 = 0;
      do {
        fVar18 = *(float *)(local_b8 + lVar17 * 4);
        fVar19 = -fVar18;
        if (-fVar18 <= fVar18) {
          fVar19 = fVar18;
        }
        local_58[lVar17] = fVar19;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      local_58[4] = 0.0;
      local_58[5] = 0.0;
      local_58[6] = 0.0;
      local_58[7] = 0.0;
      lVar17 = 0;
      do {
        fVar18 = *(float *)(local_f8 + lVar17 * 4);
        fVar19 = -fVar18;
        if (-fVar18 <= fVar18) {
          fVar19 = fVar18;
        }
        local_58[lVar17 + 4] = fVar19;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      local_88 = (undefined1  [8])0x0;
      uStack_80 = 0;
      lVar17 = 0;
      do {
        *(float *)(local_88 + lVar17 * 4) = local_58[lVar17] + local_58[lVar17 + 4];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      local_d8 = (undefined1  [8])0x0;
      uStack_d0 = 0;
      lVar17 = 0;
      do {
        *(float *)(local_d8 + lVar17 * 4) = 0.5 / *(float *)(local_88 + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
    }
    else if (iVar15 == 1) {
      local_d8 = (undefined1  [8])0x0;
      uStack_d0 = 0;
      lVar17 = 0;
      do {
        *(float *)(local_d8 + lVar17 * 4) = 0.5 / *(float *)(local_f8 + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      lVar17 = 4;
    }
    else {
      if (iVar15 != 0) goto LAB_01289382;
      local_d8 = (undefined1  [8])0x0;
      uStack_d0 = 0;
      lVar17 = 0;
      do {
        *(float *)(local_d8 + lVar17 * 4) = 0.5 / *(float *)(local_b8 + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      lVar17 = 4;
    }
    iVar15 = (int)lVar17;
    local_b8._0_4_ = local_d8._0_4_;
    local_b8._4_4_ = local_d8._4_4_;
    auStack_b0._0_4_ = (float)uStack_d0;
    auStack_b0._4_4_ = uStack_d0._4_4_;
  }
  else {
    if (SVar7 != SURFACETYPE_FLOAT_FBO) {
      local_88._4_4_ = 133.0;
      local_d8._4_4_ = 99.0;
      goto LAB_0128914d;
    }
    lVar17 = 0;
    do {
      *(undefined4 *)(local_b8 + lVar17 * 4) = 0x3f800000;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    iVar15 = 4;
  }
  (this->super_TriangleDerivateCase).m_derivScale.m_data[0] = (float)local_b8._0_4_;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[1] = (float)local_b8._4_4_;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[2] = (float)auStack_b0._0_4_;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[3] = (float)auStack_b0._4_4_;
LAB_01289382:
  (this->super_TriangleDerivateCase).m_derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[3] = 0.0;
  return iVar15;
}

Assistant:

void TextureDerivateCase::init (void)
{
	// Generate shader
	{
		const char* fragmentTmpl =
			"#version 300 es\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} sampler2D u_sampler;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n";

		const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
		map<string, string> fragmentParams;

		fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
		fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
		fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
		fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
		fragmentParams["FUNC"]				= getDerivateFuncName(m_func);
		fragmentParams["SWIZZLE"]			= m_dataType == glu::TYPE_FLOAT_VEC4 ? "" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? ".xyz" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? ".xy" :
											  /* TYPE_FLOAT */					   ".x";

		if (packToInt)
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
												  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
		}
		else
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
												  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
		}

		m_fragmentSrc = tcu::StringTemplate(fragmentTmpl).specialize(fragmentParams);
	}

	// Texture size matches viewport and nearest sampling is used. Thus texture sampling
	// is equal to just interpolating the texture value range.

	// Determine value range for texture.

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_texValueMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_texValueMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_texValueMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_texValueMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_texValueMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_texValueMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	// Lowp and mediump cases use RGBA16F format, while highp uses RGBA32F.
	{
		const tcu::IVec2 viewportSize = getViewportSize();
		DE_ASSERT(!m_texture);
		m_texture = new glu::Texture2D(m_context.getRenderContext(), m_precision == glu::PRECISION_HIGHP ? GL_RGBA32F : GL_RGBA16F, viewportSize.x(), viewportSize.y());
		m_texture->getRefTexture().allocLevel(0);
	}

	// Texture coordinates
	m_coordMin = tcu::Vec4(0.0f);
	m_coordMax = tcu::Vec4(1.0f);

	// Fill with gradients.
	{
		const tcu::PixelBufferAccess level0 = m_texture->getRefTexture().getLevel(0);
		for (int y = 0; y < level0.getHeight(); y++)
		{
			for (int x = 0; x < level0.getWidth(); x++)
			{
				const float		xf		= (float(x)+0.5f) / float(level0.getWidth());
				const float		yf		= (float(y)+0.5f) / float(level0.getHeight());
				const tcu::Vec4	s		= tcu::Vec4(xf, yf, (xf+yf)/2.0f, 1.0f - (xf+yf)/2.0f);

				level0.setPixel(m_texValueMin + (m_texValueMax - m_texValueMin)*s, x, y);
			}
		}
	}

	m_texture->upload();

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::IVec2	viewportSize	= getViewportSize();
		const float			w				= float(viewportSize.x());
		const float			h				= float(viewportSize.y());
		const tcu::Vec4		dx				= (m_texValueMax - m_texValueMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4		dy				= (m_texValueMax - m_texValueMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}